

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O1

void __thiscall deqp::sl::ShaderParser::parseValue(ShaderParser *this,ValueBlock *valueBlock)

{
  Token TVar1;
  undefined8 extraout_RAX;
  ShaderParser *this_00;
  ShaderParser *this_01;
  Value result;
  string local_90;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  DataType local_48;
  int local_44;
  pointer local_40;
  pointer pEStack_38;
  pointer local_30;
  
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_40 = (pointer)0x0;
  pEStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  TVar1 = this->m_curToken;
  local_68._M_p = (pointer)&local_58;
  if (TVar1 == TOKEN_OUTPUT) {
    local_70._0_4_ = STORAGE_OUTPUT;
  }
  else if (TVar1 == TOKEN_INPUT) {
    local_70._0_4_ = STORAGE_INPUT;
  }
  else {
    if (TVar1 != TOKEN_UNIFORM) goto LAB_00da8ffa;
    local_70._0_4_ = STORAGE_UNIFORM;
  }
  this_01 = this;
  advanceToken(this);
  this_00 = (ShaderParser *)(ulong)this->m_curToken;
  local_48 = mapDataTypeToken(this_01,this->m_curToken);
  if (local_48 == TYPE_INVALID) {
LAB_00da8fb6:
    std::operator+(&local_90,"unexpected token when parsing value data type: ",&this->m_curTokenStr)
    ;
    parseError(this,&local_90);
  }
  else {
    advanceToken(this);
    if (this->m_curToken == TOKEN_STRING) {
      parseStringLiteral_abi_cxx11_(&local_90,this_00,(this->m_curTokenStr)._M_dataplus._M_p);
      std::__cxx11::string::operator=((string *)&local_68,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
LAB_00da8e94:
      advanceToken(this);
      assumeToken(this,TOKEN_ASSIGN);
      advanceToken(this);
      if (this->m_curToken != TOKEN_LEFT_BRACKET) {
        parseValueElement(this,local_48,(Value *)local_70);
        local_44 = 1;
LAB_00da8f32:
        assumeToken(this,TOKEN_SEMI_COLON);
        advanceToken(this);
        std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>::
        push_back(&valueBlock->values,(value_type *)local_70);
        if (local_40 != (pointer)0x0) {
          operator_delete(local_40,(long)local_30 - (long)local_40);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_p != &local_58) {
          operator_delete(local_68._M_p,
                          CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]) +
                          1);
        }
        return;
      }
      assumeToken(this,TOKEN_LEFT_BRACKET);
      advanceToken(this);
      local_44 = 0;
      while( true ) {
        parseValueElement(this,local_48,(Value *)local_70);
        local_44 = local_44 + 1;
        if (this->m_curToken != TOKEN_VERTICAL_BAR) break;
        advanceToken(this);
      }
      if (this->m_curToken == TOKEN_RIGHT_BRACKET) {
        assumeToken(this,TOKEN_RIGHT_BRACKET);
        advanceToken(this);
        goto LAB_00da8f32;
      }
      std::operator+(&local_90,"unexpected token in value element array: ",&this->m_curTokenStr);
      parseError(this,&local_90);
      goto LAB_00da8fb6;
    }
    if (this->m_curToken == TOKEN_IDENTIFIER) {
      std::__cxx11::string::_M_assign((string *)&local_68);
      goto LAB_00da8e94;
    }
  }
  std::operator+(&local_90,"unexpected token when parsing value name: ",&this->m_curTokenStr);
  parseError(this,&local_90);
LAB_00da8ffa:
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"unexpected token encountered when parsing value classifier","");
  parseError(this,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  ShaderCase::Value::~Value((Value *)local_70);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ShaderParser::parseValue(ShaderCase::ValueBlock& valueBlock)
{
	PARSE_DBG(("      parseValue()\n"));

	// Parsed results.
	ShaderCase::Value result;

	// Parse storage.
	if (m_curToken == TOKEN_UNIFORM)
		result.storageType = ShaderCase::Value::STORAGE_UNIFORM;
	else if (m_curToken == TOKEN_INPUT)
		result.storageType = ShaderCase::Value::STORAGE_INPUT;
	else if (m_curToken == TOKEN_OUTPUT)
		result.storageType = ShaderCase::Value::STORAGE_OUTPUT;
	else
		parseError(string("unexpected token encountered when parsing value classifier"));
	advanceToken();

	// Parse data type.
	result.dataType = mapDataTypeToken(m_curToken);
	if (result.dataType == TYPE_INVALID)
		parseError(string("unexpected token when parsing value data type: " + m_curTokenStr));
	advanceToken();

	// Parse value name.
	if (m_curToken == TOKEN_IDENTIFIER || m_curToken == TOKEN_STRING)
	{
		if (m_curToken == TOKEN_IDENTIFIER)
			result.valueName = m_curTokenStr;
		else
			result.valueName = parseStringLiteral(m_curTokenStr.c_str());
	}
	else
		parseError(string("unexpected token when parsing value name: " + m_curTokenStr));
	advanceToken();

	// Parse assignment operator.
	advanceToken(TOKEN_ASSIGN);

	// Parse actual value.
	if (m_curToken == TOKEN_LEFT_BRACKET) // value list
	{
		advanceToken(TOKEN_LEFT_BRACKET);
		result.arrayLength = 0;

		for (;;)
		{
			parseValueElement(result.dataType, result);
			result.arrayLength++;

			if (m_curToken == TOKEN_RIGHT_BRACKET)
				break;
			else if (m_curToken == TOKEN_VERTICAL_BAR)
			{
				advanceToken();
				continue;
			}
			else
				parseError(string("unexpected token in value element array: " + m_curTokenStr));
		}

		advanceToken(TOKEN_RIGHT_BRACKET);
	}
	else // arrays, single elements
	{
		parseValueElement(result.dataType, result);
		result.arrayLength = 1;
	}

	advanceToken(TOKEN_SEMI_COLON); // end of declaration

	valueBlock.values.push_back(result);
}